

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O0

void Spatializer::GetHRTF(int channel,UnityComplexNumber *h,float azimuth,float elevation)

{
  float __x;
  float fVar1;
  int local_30;
  int local_2c;
  int index2;
  int index1;
  float f;
  float e;
  float elevation_local;
  float azimuth_local;
  UnityComplexNumber *h_local;
  int channel_local;
  
  __x = FastClip(elevation * 0.1 + 4.0,0.0,12.0);
  fVar1 = floorf(__x);
  local_2c = (int)fVar1;
  if (local_2c < 0) {
    local_2c = 0;
  }
  else if (0xc < local_2c) {
    local_2c = 0xc;
  }
  local_30 = local_2c + 1;
  if (0xc < local_30) {
    local_30 = 0xc;
  }
  HRTFData::CircleCoeffs::GetHRTF
            ((CircleCoeffs *)(sharedData + (long)local_2c * 0x18 + (long)channel * 0x150),h,azimuth,
             1.0);
  HRTFData::CircleCoeffs::GetHRTF
            ((CircleCoeffs *)(sharedData + (long)local_30 * 0x18 + (long)channel * 0x150),h,azimuth,
             __x - fVar1);
  return;
}

Assistant:

static void GetHRTF(int channel, UnityComplexNumber* h, float azimuth, float elevation)
    {
        float e = FastClip(elevation * 0.1f + 4, 0, 12);
        float f = floorf(e);
        int index1 = (int)f;
        if (index1 < 0)
            index1 = 0;
        else if (index1 > 12)
            index1 = 12;
        int index2 = index1 + 1;
        if (index2 > 12)
            index2 = 12;
        sharedData.hrtfChannel[channel][index1].GetHRTF(h, azimuth, 1.0f);
        sharedData.hrtfChannel[channel][index2].GetHRTF(h, azimuth, e - f);
    }